

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.cpp
# Opt level: O2

ssize_t __thiscall VCProjectWriter::write(VCProjectWriter *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  XmlOutput *pXVar2;
  long lVar3;
  undefined4 in_register_00000034;
  XmlOutput *this_00;
  int x;
  QString *key;
  int i;
  ulong uVar4;
  long in_FS_OFFSET;
  VCProject local_4f0;
  QArrayDataPointer<char16_t> local_3d0;
  xml_output local_3b8;
  QArrayDataPointer<char16_t> local_380;
  xml_output local_368;
  xml_output local_330;
  QArrayDataPointer<char16_t> local_2f8;
  xml_output local_2e0;
  QArrayDataPointer<char16_t> local_2a8;
  xml_output local_290;
  xml_output local_258;
  xml_output local_220;
  xml_output local_1e8;
  xml_output local_1b0;
  xml_output local_178;
  xml_output local_140;
  QArrayDataPointer<char16_t> local_108;
  xml_output local_f0;
  QArrayDataPointer<char16_t> local_b8;
  xml_output local_a0;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  this_00 = (XmlOutput *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QString::QString((QString *)&local_50,"1.0");
  QString::QString((QString *)&local_68,"Windows-1252");
  declaration((xml_output *)&local_4f0,(QString *)&local_50,(QString *)&local_68);
  pXVar2 = XmlOutput::operator<<(this_00,(xml_output *)&local_4f0);
  QString::QString((QString *)&local_b8,"VisualStudioProject");
  tag(&local_a0,(QString *)&local_b8);
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_a0);
  QString::QString((QString *)&local_108,"Visual C++");
  attrS(&local_f0,"ProjectType",(QString *)&local_108);
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_f0);
  attrS(&local_140,"Version",(QString *)((long)__buf + 0x18));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_140);
  attrS(&local_178,"Name",(QString *)__buf);
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_178);
  attrS(&local_1b0,"ProjectGUID",(QString *)((long)__buf + 0x30));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_1b0);
  attrS(&local_1e8,"Keyword",(QString *)((long)__buf + 0x48));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_1e8);
  attrS(&local_220,"SccProjectName",(QString *)((long)__buf + 0x60));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_220);
  attrS(&local_258,"SccLocalPath",(QString *)((long)__buf + 0x78));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_258);
  QString::QString((QString *)&local_2a8,"Platforms");
  tag(&local_290,(QString *)&local_2a8);
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_290);
  QString::QString((QString *)&local_2f8,"Platform");
  tag(&local_2e0,(QString *)&local_2f8);
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_2e0);
  attrS(&local_330,"Name",(QString *)((long)__buf + 0x90));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_330);
  QString::QString((QString *)&local_380,"Platforms");
  closetag(&local_368,(QString *)&local_380);
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_368);
  QString::QString((QString *)&local_3d0,"Configurations");
  tag(&local_3b8,(QString *)&local_3d0);
  XmlOutput::operator<<(pXVar2,&local_3b8);
  XmlOutput::xml_output::~xml_output(&local_3b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_3d0);
  XmlOutput::xml_output::~xml_output(&local_368);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_380);
  XmlOutput::xml_output::~xml_output(&local_330);
  XmlOutput::xml_output::~xml_output(&local_2e0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2f8);
  XmlOutput::xml_output::~xml_output(&local_290);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2a8);
  XmlOutput::xml_output::~xml_output(&local_258);
  XmlOutput::xml_output::~xml_output(&local_220);
  XmlOutput::xml_output::~xml_output(&local_1e8);
  XmlOutput::xml_output::~xml_output(&local_1b0);
  XmlOutput::xml_output::~xml_output(&local_178);
  XmlOutput::xml_output::~xml_output(&local_140);
  XmlOutput::xml_output::~xml_output(&local_f0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
  XmlOutput::xml_output::~xml_output(&local_a0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
  XmlOutput::xml_output::~xml_output((xml_output *)&local_4f0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  (*this->_vptr_VCProjectWriter[0xe])(this,this_00,(long)__buf + 0xc0);
  QString::QString((QString *)&local_f0,"Configurations");
  closetag((xml_output *)&local_4f0,(QString *)&local_f0);
  pXVar2 = XmlOutput::operator<<(this_00,(xml_output *)&local_4f0);
  QString::QString((QString *)&local_140,"Files");
  tag(&local_a0,(QString *)&local_140);
  XmlOutput::operator<<(pXVar2,&local_a0);
  XmlOutput::xml_output::~xml_output(&local_a0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_140);
  XmlOutput::xml_output::~xml_output((xml_output *)&local_4f0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f0);
  lVar3 = 0;
  memset(&local_4f0,0,0x120);
  QList<VCProjectSingleConfig>::emplaceBack<VCProjectSingleConfig_const&>
            (&local_4f0.SingleProjects,(VCProjectSingleConfig *)__buf);
  QString::QString((QString *)&local_a0,"Source Files");
  outputFilter(&local_4f0,this_00,(QString *)&local_a0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
  QString::QString((QString *)&local_a0,"Header Files");
  outputFilter(&local_4f0,this_00,(QString *)&local_a0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
  QString::QString((QString *)&local_a0,"Generated Files");
  outputFilter(&local_4f0,this_00,(QString *)&local_a0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
  QString::QString((QString *)&local_a0,"LexYacc Files");
  outputFilter(&local_4f0,this_00,(QString *)&local_a0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
  QString::QString((QString *)&local_a0,"Translation Files");
  outputFilter(&local_4f0,this_00,(QString *)&local_a0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
  QString::QString((QString *)&local_a0,"Form Files");
  outputFilter(&local_4f0,this_00,(QString *)&local_a0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
  QString::QString((QString *)&local_a0,"Resource Files");
  outputFilter(&local_4f0,this_00,(QString *)&local_a0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
  QString::QString((QString *)&local_a0,"Deployment Files");
  outputFilter(&local_4f0,this_00,(QString *)&local_a0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
  QString::QString((QString *)&local_a0,"Distribution Files");
  outputFilter(&local_4f0,this_00,(QString *)&local_a0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
  local_220.xo_type = tNothing;
  local_220._4_4_ = 0;
  for (uVar4 = 0; uVar4 < *(ulong *)((long)__buf + 0x3a00); uVar4 = uVar4 + 1) {
    key = (QString *)(*(long *)((long)__buf + 0x39f8) + lVar3);
    bVar1 = QHash<QString,_QHashDummyValue>::contains
                      ((QHash<QString,_QHashDummyValue> *)&local_220,key);
    if (!bVar1) {
      QSet<QString>::operator+=((QSet<QString> *)&local_220,key);
      QList<QString>::emplaceBack<QString_const&>(&local_4f0.ExtraCompilers,key);
    }
    lVar3 = lVar3 + 0x448;
  }
  lVar3 = 0;
  for (uVar4 = 0; uVar4 < (ulong)local_4f0.ExtraCompilers.d.size; uVar4 = uVar4 + 1) {
    outputFilter(&local_4f0,this_00,
                 (QString *)((long)&((local_4f0.ExtraCompilers.d.ptr)->d).d + lVar3));
    lVar3 = lVar3 + 0x18;
  }
  QString::QString((QString *)&local_a0,"Root Files");
  outputFilter(&local_4f0,this_00,(QString *)&local_a0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
  QString::QString((QString *)&local_178,"Files");
  closetag(&local_a0,(QString *)&local_178);
  pXVar2 = XmlOutput::operator<<(this_00,&local_a0);
  QString::QString((QString *)&local_1b0,"Globals");
  tag(&local_f0,(QString *)&local_1b0);
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_f0);
  local_1e8.xo_type = tNothing;
  local_1e8._4_4_ = 0;
  local_1e8.xo_text.d.d = (Data *)0x0;
  local_1e8.xo_text.d.ptr = (char16_t *)0x0;
  ::data(&local_140,(QString *)&local_1e8);
  XmlOutput::operator<<(pXVar2,&local_140);
  XmlOutput::xml_output::~xml_output(&local_140);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1e8);
  XmlOutput::xml_output::~xml_output(&local_f0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1b0);
  XmlOutput::xml_output::~xml_output(&local_a0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_178);
  QHash<QString,_QHashDummyValue>::~QHash((QHash<QString,_QHashDummyValue> *)&local_220);
  VCProject::~VCProject(&local_4f0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void VCProjectWriter::write(XmlOutput &xml, VCProjectSingleConfig &tool)
{
    xml << decl("1.0", "Windows-1252")
        << tag(_VisualStudioProject)
        << attrS(_ProjectType, "Visual C++")
        << attrS(_Version, tool.Version)
        << attrS(_Name, tool.Name)
        << attrS(_ProjectGUID, tool.ProjectGUID)
        << attrS(_Keyword, tool.Keyword)
        << attrS(_SccProjectName, tool.SccProjectName)
        << attrS(_SccLocalPath, tool.SccLocalPath)
        << tag(_Platforms)
        << tag(_Platform)
        << attrS(_Name, tool.PlatformName)
        << closetag(_Platforms)
        << tag(_Configurations);
    write(xml, tool.Configuration);
    xml << closetag(_Configurations)
        << tag(q_Files);
    // Add this configuration into a multi-config project, since that's where we have the flat/tree
    // XML output functionality
    VCProject tempProj;
    tempProj.SingleProjects += tool;
    outputFilter(tempProj, xml, "Source Files");
    outputFilter(tempProj, xml, "Header Files");
    outputFilter(tempProj, xml, "Generated Files");
    outputFilter(tempProj, xml, "LexYacc Files");
    outputFilter(tempProj, xml, "Translation Files");
    outputFilter(tempProj, xml, "Form Files");
    outputFilter(tempProj, xml, "Resource Files");
    outputFilter(tempProj, xml, "Deployment Files");
    outputFilter(tempProj, xml, "Distribution Files");

    QSet<QString> extraCompilersInProject;
    for (int i = 0; i < tool.ExtraCompilersFiles.size(); ++i) {
        const QString &compilerName = tool.ExtraCompilersFiles.at(i).Name;
        if (!extraCompilersInProject.contains(compilerName)) {
            extraCompilersInProject += compilerName;
            tempProj.ExtraCompilers += compilerName;
        }
    }

    for (int x = 0; x < tempProj.ExtraCompilers.size(); ++x) {
        outputFilter(tempProj, xml, tempProj.ExtraCompilers.at(x));
    }
    outputFilter(tempProj, xml, "Root Files");
    xml     << closetag(q_Files)
            << tag(_Globals)
                << data(); // No "/>" end tag
}